

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_forward_Test::
~IntrusiveListIteratorTest_rbegin_rend_forward_Test
          (IntrusiveListIteratorTest_rbegin_rend_forward_Test *this)

{
  anon_unknown.dwarf_6462d::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
            (&this->super_IntrusiveListIteratorTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_forward) {
  TestForward(list_.rbegin(), list_.rend(), {3, 2, 1});
  TestForward(clist_.rbegin(), clist_.rend(), {3, 2, 1});
}